

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# serialization.hpp
# Opt level: O2

void diy::Serialization<std::vector<diy::Bounds<long>,_std::allocator<diy::Bounds<long>_>_>_>::load
               (BinaryBuffer *bb,Vector *v)

{
  size_t __new_size;
  size_t s;
  Bounds<long> local_c0;
  
  (*bb->_vptr_BinaryBuffer[4])(bb,&s,8);
  __new_size = s;
  Bounds<long>::Bounds(&local_c0);
  std::vector<diy::Bounds<long>,_std::allocator<diy::Bounds<long>_>_>::resize
            (v,__new_size,&local_c0);
  Bounds<long>::~Bounds(&local_c0);
  if (s != 0) {
    load<diy::Bounds<long>>
              (bb,(v->super__Vector_base<diy::Bounds<long>,_std::allocator<diy::Bounds<long>_>_>).
                  _M_impl.super__Vector_impl_data._M_start,s);
  }
  return;
}

Assistant:

static void         load(BinaryBuffer& bb, Vector& v)
    {
      size_t s;
      diy::load(bb, s);
      v.resize(s, U());
      if (s > 0)
        diy::load(bb, &v[0], s);
    }